

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O3

int __thiscall FIWadManager::CheckIWAD(FIWadManager *this,char *doomwaddir,WadStuff *wads)

{
  FString *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  BYTE *pBVar6;
  ulong uVar7;
  FString iwad;
  int local_44;
  FString local_40;
  char *local_38;
  
  if (*doomwaddir == '\0') {
    pBVar6 = "";
  }
  else {
    sVar5 = strlen(doomwaddir);
    pBVar6 = "/";
    if (doomwaddir[sVar5 - 1] == '/') {
      pBVar6 = "";
    }
  }
  uVar3 = (this->mIWadNames).Count;
  if (uVar3 == 0) {
    local_44 = 0;
  }
  else {
    local_38 = FString::NullString.Nothing;
    uVar7 = 0;
    local_44 = 0;
    do {
      pFVar1 = (this->mIWadNames).Array;
      if ((*(int *)(pFVar1[uVar7].Chars + -0xc) != 0) && (*(int *)((wads->Path).Chars + -0xc) == 0))
      {
        local_40.Chars = local_38;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        FString::Format(&local_40,"%s%s%s",doomwaddir,pBVar6,pFVar1[uVar7].Chars);
        FString::ReplaceChars(&local_40,'\\','/');
        bVar2 = FileExists(local_40.Chars);
        if (bVar2) {
          iVar4 = ScanIWAD(this,local_40.Chars);
          wads->Type = iVar4;
          if (iVar4 != -1) {
            FString::operator=(&wads->Path,&local_40);
            FString::operator=(&wads->Name,&(this->mIWads).Array[wads->Type].Name);
            local_44 = local_44 + 1;
          }
        }
        FString::~FString(&local_40);
        uVar3 = (this->mIWadNames).Count;
      }
      uVar7 = uVar7 + 1;
      wads = wads + 1;
    } while (uVar7 < uVar3);
  }
  return local_44;
}

Assistant:

int FIWadManager::CheckIWAD (const char *doomwaddir, WadStuff *wads)
{
	const char *slash;
	int numfound;

	numfound = 0;

	slash = (doomwaddir[0] && doomwaddir[strlen (doomwaddir)-1] != '/') ? "/" : "";

	// Search for a pre-defined IWAD
	for (unsigned i=0; i< mIWadNames.Size(); i++)
	{
		if (mIWadNames[i].IsNotEmpty() && wads[i].Path.IsEmpty())
		{
			FString iwad;
			
			iwad.Format ("%s%s%s", doomwaddir, slash, mIWadNames[i].GetChars());
			FixPathSeperator (iwad);
			if (FileExists (iwad))
			{
				wads[i].Type = ScanIWAD (iwad);
				if (wads[i].Type != -1)
				{
					wads[i].Path = iwad;
					wads[i].Name = mIWads[wads[i].Type].Name;
					numfound++;
				}
			}
		}
	}

	return numfound;
}